

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_BOLT_OR_BEAM(effect_handler_context_t *context)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  
  wVar1 = context->other;
  wVar2 = context->beam;
  uVar3 = Rand_div(100);
  if ((int)uVar3 < wVar1 + wVar2) {
    effect_handler_BEAM(context);
  }
  else {
    effect_handler_BOLT(context);
  }
  return true;
}

Assistant:

bool effect_handler_BOLT_OR_BEAM(effect_handler_context_t *context)
{
	int beam = context->beam + context->other;

	if (randint0(100) < beam)
		return effect_handler_BEAM(context);
	else
		return effect_handler_BOLT(context);
}